

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctest.c
# Opt level: O2

char * ctest_sprintf_char(char *format,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  undefined8 local_f8;
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_e8 = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f0 = &va[0].overflow_arg_area;
  local_f8 = 0x3000000008;
  local_d0 = in_RSI;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  iVar1 = vsnprintf((char *)0x0,0,format,&local_f8);
  if (iVar1 < 0) {
    pcVar3 = "failure in vsnprintf";
  }
  else {
    pcVar3 = (char *)malloc((ulong)(iVar1 + 1));
    if (pcVar3 != (char *)0x0) {
      iVar2 = vsnprintf(pcVar3,(ulong)(iVar1 + 1),format,&local_f8);
      if (iVar2 != iVar1) {
        puts("inconsistent vsnprintf behavior");
        free(pcVar3);
        return (char *)0x0;
      }
      return pcVar3;
    }
    pcVar3 = "failure in malloc";
  }
  puts(pcVar3);
  return (char *)0x0;
}

Assistant:

char* ctest_sprintf_char(const char* format, ...)
{
    char* result;
    va_list va;
    va_start(va, format);
    result = ctest_vsprintf_char(format, va);
    va_end(va);
    return result;
}